

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_flow.cc
# Opt level: O2

void __thiscall
re2c::Node::naked_ways
          (Node *this,way_t *prefix,
          vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
          *ways,nakeds_t *size)

{
  pointer *pppvVar1;
  bool bVar2;
  _Rb_tree_node_base *p_Var3;
  ulong uVar4;
  _Base_ptr *local_38;
  
  bVar2 = rule_rank_t::is_none(&(this->rule).rank);
  if (bVar2) {
    bVar2 = end(this);
    if (bVar2) {
      std::
      vector<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>,_std::allocator<std::vector<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>_>_>
      ::push_back(ways,prefix);
      uVar4 = (long)(prefix->
                    super__Vector_base<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(prefix->
                    super__Vector_base<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3;
      if (0x3ff < uVar4) {
        uVar4 = 0x400;
      }
      uVar4 = uVar4 + size->value;
      if (0x3ff < uVar4) {
        uVar4 = 0x400;
      }
      size->value = (uint32_t)uVar4;
    }
    else if (this->loop < 2) {
      this->loop = this->loop + 1;
      p_Var3 = (this->arcsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while (((_Rb_tree_header *)p_Var3 != &(this->arcsets)._M_t._M_impl.super__Rb_tree_header &&
             (size->value != 0x400))) {
        local_38 = &p_Var3[1]._M_parent;
        std::
        vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>const*,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>const*>>
        ::
        emplace_back<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>const*>
                  ((vector<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>const*,std::allocator<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>const*>>
                    *)prefix,
                   (vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                    **)&local_38);
        naked_ways(*(Node **)(p_Var3 + 1),prefix,ways,size);
        pppvVar1 = &(prefix->
                    super__Vector_base<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*,_std::allocator<const_std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_*>_>
                    )._M_impl.super__Vector_impl_data._M_finish;
        *pppvVar1 = *pppvVar1 + -1;
        p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
      }
      this->loop = this->loop + 0xff;
    }
  }
  return;
}

Assistant:

void Node::naked_ways (way_t & prefix, std::vector<way_t> & ways, nakeds_t &size)
{
	if (!rule.rank.is_none ())
	{
		return;
	}
	else if (end ())
	{
		ways.push_back (prefix);
		size = size + nakeds_t::from64(prefix.size ());
	}
	else if (loop < 2)
	{
		local_inc _ (loop);
		for (arcsets_t::iterator i = arcsets.begin ();
			i != arcsets.end () && !size.overflow (); ++i)
		{
			prefix.push_back (&i->second);
			i->first->naked_ways (prefix, ways, size);
			prefix.pop_back ();
		}
	}
}